

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20>::Resize
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20> *this,int64_t newsize
          ,TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *object)

{
  ulong uVar1;
  TPZReference *pTVar2;
  ulong *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar8;
  ulong uVar9;
  double dVar10;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar7 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements;
  if (newsize != lVar7) {
    lVar6 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc;
    if (lVar6 < newsize) {
      if (newsize < 0x15) {
        if ((this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements < 1)
        {
          lVar7 = 0;
        }
        else {
          lVar6 = 0;
          lVar7 = 0;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                      ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&this->fExtAlloc[0].fRef + lVar6),
                       (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&((this->
                                super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                               fStore)->fRef + lVar6));
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + 8;
          } while (lVar7 < (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                           fNElements);
        }
        lVar6 = newsize - lVar7;
        if (lVar6 != 0 && lVar7 <= newsize) {
          pTVar8 = this->fExtAlloc + lVar7;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=(pTVar8,object);
            pTVar8 = pTVar8 + 1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        pTVar8 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore;
        if (pTVar8 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0 &&
            pTVar8 != this->fExtAlloc) {
          pTVar2 = pTVar8[-1].fRef;
          if (pTVar2 != (TPZReference *)0x0) {
            lVar7 = (long)pTVar2 * 8;
            do {
              TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                        ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                         ((long)&pTVar8[-1].fRef + lVar7));
              lVar7 = lVar7 + -8;
            } while (lVar7 != 0);
          }
          operator_delete__(pTVar8 + -1,(long)pTVar2 * 8 + 8);
        }
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore =
             this->fExtAlloc;
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
             newsize;
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = 0x14;
      }
      else {
        dVar10 = (double)lVar6 * 1.2;
        uVar9 = (long)dVar10;
        if (dVar10 < (double)newsize) {
          uVar9 = newsize;
        }
        uVar1 = uVar9 * 8;
        uVar5 = 0xffffffffffffffff;
        if (uVar1 < 0xfffffffffffffff8) {
          uVar5 = uVar1 + 8;
        }
        puVar3 = (ulong *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar5);
        *puVar3 = uVar9;
        if (uVar9 != 0) {
          lVar7 = 0;
          do {
            puVar4 = (undefined8 *)operator_new(0x10);
            *puVar4 = 0;
            *(undefined4 *)(puVar4 + 1) = 0;
            LOCK();
            *(undefined4 *)(puVar4 + 1) = 1;
            UNLOCK();
            *(undefined8 **)((long)puVar3 + lVar7 + 8) = puVar4;
            lVar7 = lVar7 + 8;
          } while (uVar1 - lVar7 != 0);
        }
        if ((this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements < 1)
        {
          lVar7 = 0;
        }
        else {
          lVar6 = 0;
          lVar7 = 0;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                      ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(puVar3 + 1))->
                               fRef + lVar6),
                       (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                       ((long)&((this->
                                super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                               fStore)->fRef + lVar6));
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + 8;
          } while (lVar7 < (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                           fNElements);
        }
        lVar6 = newsize - lVar7;
        if (lVar6 != 0 && lVar7 <= newsize) {
          pTVar8 = (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(puVar3 + lVar7);
          do {
            pTVar8 = pTVar8 + 1;
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=(pTVar8,object);
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        pTVar8 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore;
        if (pTVar8 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0 &&
            pTVar8 != this->fExtAlloc) {
          pTVar2 = pTVar8[-1].fRef;
          if (pTVar2 != (TPZReference *)0x0) {
            lVar7 = (long)pTVar2 * 8;
            do {
              TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                        ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                         ((long)&pTVar8[-1].fRef + lVar7));
              lVar7 = lVar7 + -8;
            } while (lVar7 != 0);
          }
          operator_delete__(pTVar8 + -1,(long)pTVar2 * 8 + 8);
        }
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore =
             (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(puVar3 + 1);
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
             newsize;
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = uVar9;
      }
    }
    else {
      lVar6 = newsize - lVar7;
      if (lVar6 != 0 && lVar7 <= newsize) {
        lVar7 = lVar7 << 3;
        do {
          TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                    ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                     ((long)&((this->
                              super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                             fStore)->fRef + lVar7),object);
          lVar7 = lVar7 + 8;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}